

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

OperationType vkt::sr::anon_unknown_0::MatrixCaseUtils::getOperationType(MatrixOp op)

{
  OperationType local_c;
  MatrixOp op_local;
  
  switch(op) {
  case OP_ADD:
    local_c = OPERATIONTYPE_BINARY_OPERATOR;
    break;
  case OP_SUB:
    local_c = OPERATIONTYPE_BINARY_OPERATOR;
    break;
  case OP_MUL:
    local_c = OPERATIONTYPE_BINARY_OPERATOR;
    break;
  case OP_DIV:
    local_c = OPERATIONTYPE_BINARY_OPERATOR;
    break;
  case OP_COMP_MUL:
    local_c = OPERATIONTYPE_BINARY_FUNCTION;
    break;
  case OP_OUTER_PRODUCT:
    local_c = OPERATIONTYPE_BINARY_FUNCTION;
    break;
  case OP_TRANSPOSE:
    local_c = OPERATIONTYPE_UNARY_FUNCTION;
    break;
  case OP_INVERSE:
    local_c = OPERATIONTYPE_UNARY_FUNCTION;
    break;
  case OP_DETERMINANT:
    local_c = OPERATIONTYPE_UNARY_FUNCTION;
    break;
  case OP_UNARY_PLUS:
    local_c = OPERATIONTYPE_UNARY_PREFIX_OPERATOR;
    break;
  case OP_NEGATION:
    local_c = OPERATIONTYPE_UNARY_PREFIX_OPERATOR;
    break;
  case OP_PRE_INCREMENT:
    local_c = OPERATIONTYPE_UNARY_PREFIX_OPERATOR;
    break;
  case OP_PRE_DECREMENT:
    local_c = OPERATIONTYPE_UNARY_PREFIX_OPERATOR;
    break;
  case OP_POST_INCREMENT:
    local_c = OPERATIONTYPE_UNARY_POSTFIX_OPERATOR;
    break;
  case OP_POST_DECREMENT:
    local_c = OPERATIONTYPE_UNARY_POSTFIX_OPERATOR;
    break;
  case OP_ADD_INTO:
    local_c = OPERATIONTYPE_ASSIGNMENT;
    break;
  case OP_SUBTRACT_FROM:
    local_c = OPERATIONTYPE_ASSIGNMENT;
    break;
  case OP_MULTIPLY_INTO:
    local_c = OPERATIONTYPE_ASSIGNMENT;
    break;
  case OP_DIVIDE_INTO:
    local_c = OPERATIONTYPE_ASSIGNMENT;
    break;
  default:
    local_c = OPERATIONTYPE_LAST;
  }
  return local_c;
}

Assistant:

static OperationType getOperationType (MatrixOp op)
{
	switch (op)
	{
		case OP_ADD:			return OPERATIONTYPE_BINARY_OPERATOR;
		case OP_SUB:			return OPERATIONTYPE_BINARY_OPERATOR;
		case OP_MUL:			return OPERATIONTYPE_BINARY_OPERATOR;
		case OP_DIV:			return OPERATIONTYPE_BINARY_OPERATOR;
		case OP_COMP_MUL:		return OPERATIONTYPE_BINARY_FUNCTION;
		case OP_OUTER_PRODUCT:	return OPERATIONTYPE_BINARY_FUNCTION;
		case OP_TRANSPOSE:		return OPERATIONTYPE_UNARY_FUNCTION;
		case OP_INVERSE:		return OPERATIONTYPE_UNARY_FUNCTION;
		case OP_DETERMINANT:	return OPERATIONTYPE_UNARY_FUNCTION;
		case OP_UNARY_PLUS:		return OPERATIONTYPE_UNARY_PREFIX_OPERATOR;
		case OP_NEGATION:		return OPERATIONTYPE_UNARY_PREFIX_OPERATOR;
		case OP_PRE_INCREMENT:	return OPERATIONTYPE_UNARY_PREFIX_OPERATOR;
		case OP_PRE_DECREMENT:	return OPERATIONTYPE_UNARY_PREFIX_OPERATOR;
		case OP_POST_INCREMENT:	return OPERATIONTYPE_UNARY_POSTFIX_OPERATOR;
		case OP_POST_DECREMENT:	return OPERATIONTYPE_UNARY_POSTFIX_OPERATOR;
		case OP_ADD_INTO:		return OPERATIONTYPE_ASSIGNMENT;
		case OP_SUBTRACT_FROM:	return OPERATIONTYPE_ASSIGNMENT;
		case OP_MULTIPLY_INTO:	return OPERATIONTYPE_ASSIGNMENT;
		case OP_DIVIDE_INTO:	return OPERATIONTYPE_ASSIGNMENT;
		default:
			DE_ASSERT(DE_FALSE);
			return OPERATIONTYPE_LAST;
	}
}